

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Reader * __thiscall
kj::_::NullableValue<capnp::compiler::LocatedInteger::Reader>::
emplace<capnp::compiler::LocatedInteger::Reader&>
          (NullableValue<capnp::compiler::LocatedInteger::Reader> *this,Reader *params)

{
  Reader *params_00;
  Reader *params_local;
  NullableValue<capnp::compiler::LocatedInteger::Reader> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<capnp::compiler::LocatedInteger::Reader>(&(this->field_1).value);
  }
  params_00 = fwd<capnp::compiler::LocatedInteger::Reader&>(params);
  ctor<capnp::compiler::LocatedInteger::Reader,capnp::compiler::LocatedInteger::Reader&>
            (&(this->field_1).value,params_00);
  this->isSet = true;
  return (Reader *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }